

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vtzone.cpp
# Opt level: O0

void __thiscall icu_63::VTimeZone::VTimeZone(VTimeZone *this,VTimeZone *source)

{
  UBool UVar1;
  int iVar2;
  int32_t initialCapacity;
  undefined4 extraout_var;
  UVector *pUVar3;
  long *plVar4;
  void *obj;
  UnicodeString *that;
  UVector *local_80;
  UnicodeString *line;
  int32_t i;
  UErrorCode local_28;
  int32_t size;
  UErrorCode status;
  VTimeZone *local_18;
  VTimeZone *source_local;
  VTimeZone *this_local;
  
  local_18 = source;
  source_local = this;
  BasicTimeZone::BasicTimeZone(&this->super_BasicTimeZone,&source->super_BasicTimeZone);
  (this->super_BasicTimeZone).super_TimeZone.super_UObject._vptr_UObject =
       (_func_int **)&PTR__VTimeZone_004a9500;
  this->tz = (BasicTimeZone *)0x0;
  this->vtzlines = (UVector *)0x0;
  UnicodeString::UnicodeString(&this->tzurl,&local_18->tzurl);
  this->lastmod = local_18->lastmod;
  UnicodeString::UnicodeString(&this->olsonzid,&local_18->olsonzid);
  that = &local_18->icutzver;
  UnicodeString::UnicodeString(&this->icutzver,that);
  if (local_18->tz != (BasicTimeZone *)0x0) {
    iVar2 = (*(local_18->tz->super_TimeZone).super_UObject._vptr_UObject[0xc])();
    this->tz = (BasicTimeZone *)CONCAT44(extraout_var,iVar2);
  }
  if (local_18->vtzlines != (UVector *)0x0) {
    local_28 = U_ZERO_ERROR;
    initialCapacity = UVector::size(local_18->vtzlines);
    pUVar3 = (UVector *)UMemory::operator_new((UMemory *)0x28,(size_t)that);
    local_80 = (UVector *)0x0;
    if (pUVar3 != (UVector *)0x0) {
      UVector::UVector(pUVar3,uprv_deleteUObject_63,uhash_compareUnicodeString_63,initialCapacity,
                       &local_28);
      local_80 = pUVar3;
    }
    this->vtzlines = local_80;
    UVar1 = ::U_SUCCESS(local_28);
    if (UVar1 != '\0') {
      for (line._0_4_ = 0; (int)line < initialCapacity; line._0_4_ = (int)line + 1) {
        plVar4 = (long *)UVector::elementAt(local_18->vtzlines,(int)line);
        pUVar3 = this->vtzlines;
        obj = (void *)(**(code **)(*plVar4 + 0x38))();
        UVector::addElement(pUVar3,obj,&local_28);
        UVar1 = ::U_FAILURE(local_28);
        if (UVar1 != '\0') break;
      }
    }
    UVar1 = ::U_FAILURE(local_28);
    if (((UVar1 != '\0') && (this->vtzlines != (UVector *)0x0)) &&
       (this->vtzlines != (UVector *)0x0)) {
      (*(this->vtzlines->super_UObject)._vptr_UObject[1])();
    }
  }
  return;
}

Assistant:

VTimeZone::VTimeZone(const VTimeZone& source)
:   BasicTimeZone(source), tz(NULL), vtzlines(NULL),
    tzurl(source.tzurl), lastmod(source.lastmod),
    olsonzid(source.olsonzid), icutzver(source.icutzver) {
    if (source.tz != NULL) {
        tz = (BasicTimeZone*)source.tz->clone();
    }
    if (source.vtzlines != NULL) {
        UErrorCode status = U_ZERO_ERROR;
        int32_t size = source.vtzlines->size();
        vtzlines = new UVector(uprv_deleteUObject, uhash_compareUnicodeString, size, status);
        if (U_SUCCESS(status)) {
            for (int32_t i = 0; i < size; i++) {
                UnicodeString *line = (UnicodeString*)source.vtzlines->elementAt(i);
                vtzlines->addElement(line->clone(), status);
                if (U_FAILURE(status)) {
                    break;
                }
            }
        }
        if (U_FAILURE(status) && vtzlines != NULL) {
            delete vtzlines;
        }
    }
}